

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_table_functions.cpp
# Opt level: O3

unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true> __thiscall
duckdb::DefaultTableFunctionGenerator::CreateTableMacroInfo
          (DefaultTableFunctionGenerator *this,DefaultTableMacro *default_macro)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  ParserOptions options_p;
  reference pvVar2;
  pointer pSVar3;
  SelectStatement *pSVar4;
  TableMacroFunction *this_00;
  InternalException *this_01;
  Parser parser;
  allocator local_99;
  _Head_base<0UL,_duckdb::MacroFunction_*,_false> local_98;
  string local_90;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  Parser local_58;
  
  local_70 = 1;
  uStack_68 = 1000;
  local_60 = 0;
  options_p.max_expression_depth = 1000;
  options_p.preserve_identifier_case = true;
  options_p.integer_division = false;
  options_p._2_6_ = 0;
  options_p.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
  Parser::Parser(&local_58,options_p);
  ::std::__cxx11::string::string((string *)&local_90,default_macro->macro,&local_99);
  Parser::ParseQuery(&local_58,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((long)local_58.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::operator[](&local_58.statements,0);
    pSVar3 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(pvVar2);
    if (pSVar3->type == SELECT_STATEMENT) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
               ::operator[](&local_58.statements,0);
      pSVar3 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(pvVar2);
      pSVar4 = SQLStatement::Cast<duckdb::SelectStatement>(pSVar3);
      _Var1._M_head_impl =
           (pSVar4->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar4->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      this_00 = (TableMacroFunction *)operator_new(0x68);
      local_90._M_dataplus._M_p = (pointer)_Var1._M_head_impl;
      TableMacroFunction::TableMacroFunction
                (this_00,(unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                          *)&local_90);
      if ((QueryNode *)local_90._M_dataplus._M_p != (QueryNode *)0x0) {
        (*(*(_func_int ***)local_90._M_dataplus._M_p)[1])();
      }
      local_98._M_head_impl = (MacroFunction *)this_00;
      CreateInternalTableMacroInfo
                (this,default_macro,
                 (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                  *)&local_98);
      if ((TableMacroFunction *)local_98._M_head_impl != (TableMacroFunction *)0x0) {
        (*((MacroFunction *)&(local_98._M_head_impl)->_vptr_MacroFunction)->_vptr_MacroFunction[1])
                  ();
      }
      local_98._M_head_impl = (MacroFunction *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&local_58);
      return (unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>)
             (unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>)
             this;
    }
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Expected a single select statement in CreateTableMacroInfo internal","");
  InternalException::InternalException(this_01,&local_90);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateMacroInfo>
DefaultTableFunctionGenerator::CreateTableMacroInfo(const DefaultTableMacro &default_macro) {
	Parser parser;
	parser.ParseQuery(default_macro.macro);
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::SELECT_STATEMENT) {
		throw InternalException("Expected a single select statement in CreateTableMacroInfo internal");
	}
	auto node = std::move(parser.statements[0]->Cast<SelectStatement>().node);

	auto result = make_uniq<TableMacroFunction>(std::move(node));
	return CreateInternalTableMacroInfo(default_macro, std::move(result));
}